

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  ImGuiTableColumn *pIVar1;
  void *__s;
  ImGuiTableCellData *pIVar2;
  ImGuiTableColumn *pIVar3;
  size_t size;
  ImSpanAllocator<3> span_allocator;
  
  size = (size_t)(columns_count * 0x71);
  __s = MemAlloc(size);
  table->RawData = __s;
  memset(__s,0,size);
  pIVar1 = (ImGuiTableColumn *)table->RawData;
  pIVar3 = (ImGuiTableColumn *)((long)&(pIVar1->ClipRect).Min.x + (long)(columns_count * 0x68));
  (table->Columns).Data = pIVar1;
  (table->Columns).DataEnd = pIVar3;
  pIVar2 = (ImGuiTableCellData *)((long)&(pIVar1->ClipRect).Min.x + (long)(columns_count * 0x69));
  (table->DisplayOrderToIndex).Data = (char *)pIVar3;
  (table->DisplayOrderToIndex).DataEnd = (char *)pIVar2;
  (table->RowCellData).Data = pIVar2;
  (table->RowCellData).DataEnd = (ImGuiTableCellData *)((long)&(pIVar1->ClipRect).Min.x + size);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    ImSpanAllocator<3> span_allocator;
    span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.ReserveBytes(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
}